

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,PatternPtr *underlyingPattern)

{
  element_type *this_00;
  string *name;
  PatternPtr *underlyingPattern_local;
  ExcludedPattern *this_local;
  
  this_00 = clara::std::
            __shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)underlyingPattern);
  name = Pattern::name_abi_cxx11_(this_00);
  Pattern::Pattern(&this->super_Pattern,name);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__ExcludedPattern_00404678;
  clara::std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr
            (&this->m_underlyingPattern,underlyingPattern);
  return;
}

Assistant:

TestSpec::ExcludedPattern::ExcludedPattern( PatternPtr const& underlyingPattern )
    : Pattern( underlyingPattern->name() )
    , m_underlyingPattern( underlyingPattern )
    {}